

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

char * bn_to_cstr(bn_t *bignumber)

{
  char *str;
  size_t n;
  size_t sVar1;
  char *local_20;
  char *ret;
  size_t max_bn_hex_len;
  bn_t *bignumber_local;
  
  ret = (char *)0x100;
  max_bn_hex_len = (size_t)bignumber;
  local_20 = cstr_new_str(0x102);
  cstr_fill_bytes(&local_20,'\0',(size_t)(ret + 2));
  n = max_bn_hex_len;
  str = local_20;
  sVar1 = cstr_strlen(local_20);
  bignum_to_string((bn *)n,str,(int)sVar1);
  return local_20;
}

Assistant:

static char*
bn_to_cstr(bn_t* bignumber)
{
  /* tiny-bignum-c has 256 as its longest length for a hexadecimal string */
  size_t max_bn_hex_len = 256;

  /* adding +1 for trailing NUL-byte and another +1 to make the number even */
  char* ret = cstr.new_str(max_bn_hex_len + 2);
  cstr.fill_bytes(&ret, '\0', max_bn_hex_len + 2);
  bignum_to_string(&bignumber->inner, ret, cstr.strlen(ret));
  return ret;
}